

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sparse_basic.c
# Opt level: O0

void verify_sparse_file(archive *a,char *path,sparse *sparse,int expected_holes)

{
  size_t *psVar1;
  size_t sVar2;
  wchar_t wVar3;
  int iVar4;
  long lVar5;
  la_int64_t lVar6;
  char *end_2;
  char *end_1;
  char *end;
  char *start;
  long lStack_58;
  int holes_seen;
  int64_t last_offset;
  int64_t expected_offset;
  int64_t offset;
  size_t bytes_read;
  void *buff;
  archive_entry *ae;
  sparse *psStack_20;
  int expected_holes_local;
  sparse *sparse_local;
  char *path_local;
  archive *a_local;
  
  start._4_4_ = 0;
  ae._4_4_ = expected_holes;
  psStack_20 = sparse;
  sparse_local = (sparse *)path;
  path_local = (char *)a;
  create_sparse_file(path,sparse);
  buff = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,L'œ',(uint)((archive_entry *)buff != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  wVar3 = archive_read_disk_open((archive *)path_local,(char *)sparse_local);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'Ŕ',0,"ARCHIVE_OK",(long)wVar3,"archive_read_disk_open(a, path)",path_local
                     );
  iVar4 = archive_read_next_header2((archive *)path_local,(archive_entry *)buff);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                      ,L'ŕ',0,"ARCHIVE_OK",(long)iVar4,"archive_read_next_header2(a, ae)",
                      path_local);
  last_offset = 0;
  lStack_58 = 0;
  do {
    iVar4 = archive_read_data_block
                      ((archive *)path_local,(void **)&bytes_read,(size_t *)&offset,&expected_offset
                      );
    sVar2 = bytes_read;
    if (iVar4 != 0) {
      lVar6 = archive_entry_size((archive_entry *)buff);
      if (lStack_58 < lVar6) {
        start._4_4_ = start._4_4_ + 1;
      }
      for (; psStack_20->type == HOLE; psStack_20 = psStack_20 + 1) {
        last_offset = psStack_20->size + last_offset;
      }
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                       ,L'ƴ',(uint)(psStack_20->type == END),"sparse->type == END",(void *)0x0);
      lVar6 = archive_entry_size((archive_entry *)buff);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                          ,L'Ƶ',last_offset,"expected_offset",lVar6,"archive_entry_size(ae)",
                          (void *)0x0);
      failure("%s",sparse_local);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                          ,L'Ƹ',(long)start._4_4_,"holes_seen",(long)ae._4_4_,"expected_holes",
                          (void *)0x0);
      iVar4 = archive_read_close((archive *)path_local);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                          ,L'ƺ',0,"ARCHIVE_OK",(long)iVar4,"archive_read_close(a)",path_local);
      archive_entry_free((archive_entry *)buff);
      return;
    }
    end = (char *)bytes_read;
    if (lStack_58 < expected_offset) {
      start._4_4_ = start._4_4_ + 1;
    }
    for (; (long)(last_offset + psStack_20->size) < expected_offset;
        last_offset = *psVar1 + last_offset) {
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                       ,L'Ũ',(uint)(psStack_20->type == HOLE),"sparse->type == HOLE",(void *)0x0);
      psVar1 = &psStack_20->size;
      psStack_20 = psStack_20 + 1;
    }
    if ((last_offset < expected_offset) &&
       ((long)(last_offset + psStack_20->size) <= expected_offset + offset)) {
      end = (char *)(bytes_read + (last_offset - expected_offset) + psStack_20->size);
      if (psStack_20->type == HOLE) {
        assertion_memory_filled_with
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,L'Ŵ',(void *)sVar2,"start",(long)end - sVar2,"end - start",'\0',"\'\\0\'",
                   (void *)0x0);
      }
      else {
        wVar3 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                                 ,L'ŵ',(uint)(psStack_20->type == DATA),"sparse->type == DATA",
                                 (void *)0x0);
        if (wVar3 != L'\0') {
          assertion_memory_filled_with
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                     ,L'Ŷ',(void *)sVar2,"start",(long)end - sVar2,"end - start",' ',"\' \'",
                     (void *)0x0);
        }
      }
      last_offset = psStack_20->size + last_offset;
      psStack_20 = psStack_20 + 1;
    }
    for (; (long)(last_offset + psStack_20->size) <= expected_offset + offset;
        last_offset = sVar2 + last_offset) {
      end_2 = (char *)(bytes_read + (last_offset - expected_offset) + psStack_20->size);
      if (psStack_20->type == HOLE) {
        if ((char *)(bytes_read + offset) < end_2) {
          end_2 = (char *)(bytes_read + offset);
        }
        assertion_memory_filled_with
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,L'ƈ',end,"start",(long)end_2 - (long)end,"end - start",'\0',"\'\\0\'",
                   (void *)0x0);
        sVar2 = psStack_20->size;
      }
      else {
        if (psStack_20->type != DATA) break;
        wVar3 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                                 ,L'Ƒ',(uint)(last_offset + psStack_20->size <=
                                              (ulong)(expected_offset + offset)),
                                 "expected_offset + sparse->size <= offset + bytes_read",(void *)0x0
                                );
        if (wVar3 != L'\0') {
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                           ,L'ƒ',(uint)(end == (char *)(bytes_read +
                                                        (last_offset - expected_offset))),
                           "start == (const char *)buff + (size_t)(expected_offset - offset)",
                           (void *)0x0);
          assertion_memory_filled_with
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                     ,L'Ɠ',end,"start",(long)end_2 - (long)end,"end - start",' ',"\' \'",
                     (void *)0x0);
        }
        sVar2 = psStack_20->size;
      }
      psStack_20 = psStack_20 + 1;
      end = end_2;
    }
    if (last_offset < expected_offset + offset) {
      lVar5 = bytes_read + offset;
      if (psStack_20->type == HOLE) {
        assertion_memory_filled_with
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                   ,L'ƣ',end,"start",lVar5 - (long)end,"end - start",'\0',"\'\\0\'",(void *)0x0);
      }
      else {
        wVar3 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                                 ,L'Ƥ',(uint)(psStack_20->type == DATA),"sparse->type == DATA",
                                 (void *)0x0);
        if (wVar3 != L'\0') {
          assertion_memory_filled_with
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_sparse_basic.c"
                     ,L'ƥ',end,"start",lVar5 - (long)end,"end - start",' ',"\' \'",(void *)0x0);
        }
      }
    }
    lStack_58 = expected_offset + offset;
  } while( true );
}

Assistant:

static void
verify_sparse_file(struct archive *a, const char *path,
    const struct sparse *sparse, int expected_holes)
{
	struct archive_entry *ae;
	const void *buff;
	size_t bytes_read;
	int64_t offset, expected_offset, last_offset;
	int holes_seen = 0;

	create_sparse_file(path, sparse);
	assert((ae = archive_entry_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_disk_open(a, path));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_next_header2(a, ae));

	expected_offset = 0;
	last_offset = 0;
	while (ARCHIVE_OK == archive_read_data_block(a, &buff, &bytes_read,
	    &offset)) {
		const char *start = buff;
#if DEBUG
		fprintf(stderr, "%s: bytes_read=%d offset=%d\n", path, (int)bytes_read, (int)offset);
#endif
		if (offset > last_offset) {
			++holes_seen;
		}
		/* Blocks entirely before the data we just read. */
		while (expected_offset + (int64_t)sparse->size < offset) {
#if DEBUG
			fprintf(stderr, "    skipping expected_offset=%d, size=%d\n", (int)expected_offset, (int)sparse->size);
#endif
			/* Must be holes. */
			assert(sparse->type == HOLE);
			expected_offset += sparse->size;
			++sparse;
		}
		/* Block that overlaps beginning of data */
		if (expected_offset < offset
		    && expected_offset + (int64_t)sparse->size <= offset + (int64_t)bytes_read) {
			const char *end = (const char *)buff + (expected_offset - offset) + (size_t)sparse->size;
#if DEBUG
			fprintf(stderr, "    overlapping hole expected_offset=%d, size=%d\n", (int)expected_offset, (int)sparse->size);
#endif
			if (sparse->type == HOLE) {
				assertMemoryFilledWith(start, end - start, '\0');
			} else if (assert(sparse->type == DATA)) {
				assertMemoryFilledWith(start, end - start, ' ');
			}
			start = end;
			expected_offset += sparse->size;
			++sparse;
		}
		/* Blocks completely contained in data we just read. */
		while (expected_offset + (int64_t)sparse->size <= offset + (int64_t)bytes_read) {
			const char *end = (const char *)buff + (expected_offset - offset) + (size_t)sparse->size;
			if (sparse->type == HOLE) {
#if DEBUG
				fprintf(stderr, "    contained hole expected_offset=%d, size=%d\n", (int)expected_offset, (int)sparse->size);
#endif

				/* verify data corresponding to hole is '\0' */
				if (end > (const char *)buff + bytes_read) {
					end = (const char *)buff + bytes_read;
				}
				assertMemoryFilledWith(start, end - start, '\0');
				start = end;
				expected_offset += sparse->size;
				++sparse;
			} else if (sparse->type == DATA) {
#if DEBUG
				fprintf(stderr, "    contained data expected_offset=%d, size=%d\n", (int)expected_offset, (int)sparse->size);
#endif
				/* verify data corresponding to hole is ' ' */
				if (assert(expected_offset + sparse->size <= offset + bytes_read)) {
					assert(start == (const char *)buff + (size_t)(expected_offset - offset));
					assertMemoryFilledWith(start, end - start, ' ');
				}
				start = end;
				expected_offset += sparse->size;
				++sparse;
			} else {
				break;
			}
		}
		/* Block that overlaps end of data */
		if (expected_offset < offset + (int64_t)bytes_read) {
			const char *end = (const char *)buff + bytes_read;
#if DEBUG
			fprintf(stderr, "    trailing overlap expected_offset=%d, size=%d\n", (int)expected_offset, (int)sparse->size);
#endif
			if (sparse->type == HOLE) {
				assertMemoryFilledWith(start, end - start, '\0');
			} else if (assert(sparse->type == DATA)) {
				assertMemoryFilledWith(start, end - start, ' ');
			}
		}
		last_offset = offset + bytes_read;
	}
	/* Count a hole at EOF? */
	if (last_offset < archive_entry_size(ae)) {
		++holes_seen;
	}

	/* Verify blocks after last read */
	while (sparse->type == HOLE) {
		expected_offset += sparse->size;
		++sparse;
	}
	assert(sparse->type == END);
	assertEqualInt(expected_offset, archive_entry_size(ae));

	failure("%s", path);
	assertEqualInt(holes_seen, expected_holes);

	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	archive_entry_free(ae);
}